

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O2

int __thiscall HighsNodeQueue::unlink(HighsNodeQueue *this,char *__name)

{
  int extraout_EAX;
  char *local_18;
  
  local_18 = __name;
  if ((this->nodes).
      super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)__name].estimate < INFINITY) {
    unlink_estim(this,(int64_t)__name);
    unlink_lower(this,(int64_t)__name);
  }
  else {
    unlink_suboptimal(this,(int64_t)__name);
  }
  unlink_domchgs(this,(int64_t)__name);
  std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::push
            (&this->freeslots,(value_type *)&local_18);
  return extraout_EAX;
}

Assistant:

void HighsNodeQueue::unlink(int64_t node) {
  if (nodes[node].estimate == kHighsInf) {
    unlink_suboptimal(node);
  } else {
    unlink_estim(node);
    unlink_lower(node);
  }
  unlink_domchgs(node);
  freeslots.push(node);
}